

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

size_t ans_byte_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint64_t *state;
  uint64_t state_00;
  uint8_t **out_u8_00;
  uint64_t state_01;
  long in_RCX;
  ans_byte_encode *in_RDI;
  size_t cur_sym;
  uint64_t state_d;
  uint64_t state_c;
  uint64_t state_b;
  uint64_t state_a;
  uint8_t *out_u8;
  ans_byte_encode ans_frame;
  uint8_t *in_u8;
  long local_1268;
  ans_byte_encode *this;
  uint8_t **in_stack_fffffffffffff1c8;
  ans_byte_encode *in_stack_fffffffffffff1d0;
  size_t in_stack_fffffffffffff7e8;
  uint8_t *in_stack_fffffffffffff7f0;
  
  ans_byte_encode::create(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  this = in_RDI;
  ans_byte_encode::serialize(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  state = (uint64_t *)ans_byte_encode::initial_state((ans_byte_encode *)&stack0xffffffffffffedc8);
  state_00 = ans_byte_encode::initial_state((ans_byte_encode *)&stack0xffffffffffffedc8);
  out_u8_00 = (uint8_t **)
              ans_byte_encode::initial_state((ans_byte_encode *)&stack0xffffffffffffedc8);
  state_01 = ans_byte_encode::initial_state((ans_byte_encode *)&stack0xffffffffffffedc8);
  for (local_1268 = 0; (in_RCX - local_1268 & 3U) != 0; local_1268 = local_1268 + 1) {
    ans_byte_encode::encode_symbol(this,state,(uint8_t)(state_00 >> 0x38),out_u8_00);
  }
  for (; local_1268 != in_RCX; local_1268 = local_1268 + 4) {
    ans_byte_encode::encode_symbol(this,state,(uint8_t)(state_00 >> 0x38),out_u8_00);
    ans_byte_encode::encode_symbol(this,state,(uint8_t)(state_00 >> 0x38),out_u8_00);
    ans_byte_encode::encode_symbol(this,state,(uint8_t)(state_00 >> 0x38),out_u8_00);
    ans_byte_encode::encode_symbol(this,state,(uint8_t)(state_00 >> 0x38),out_u8_00);
  }
  ans_byte_encode::flush_state
            ((ans_byte_encode *)&stack0xffffffffffffedc8,(uint64_t)state,
             (uint8_t **)&stack0xffffffffffffedc0);
  ans_byte_encode::flush_state
            ((ans_byte_encode *)&stack0xffffffffffffedc8,state_00,
             (uint8_t **)&stack0xffffffffffffedc0);
  ans_byte_encode::flush_state
            ((ans_byte_encode *)&stack0xffffffffffffedc8,(uint64_t)out_u8_00,
             (uint8_t **)&stack0xffffffffffffedc0);
  ans_byte_encode::flush_state
            ((ans_byte_encode *)&stack0xffffffffffffedc8,state_01,
             (uint8_t **)&stack0xffffffffffffedc0);
  return (long)this - (long)in_RDI;
}

Assistant:

size_t ans_byte_compress(
    void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(src);
    auto ans_frame = ans_byte_encode::create(in_u8, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding
    uint64_t state_a = ans_frame.initial_state();
    uint64_t state_b = ans_frame.initial_state();
    uint64_t state_c = ans_frame.initial_state();
    uint64_t state_d = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(state_b, in_u8[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(state_c, in_u8[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(state_d, in_u8[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(state_a, out_u8);
    ans_frame.flush_state(state_b, out_u8);
    ans_frame.flush_state(state_c, out_u8);
    ans_frame.flush_state(state_d, out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}